

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Snapshot * __thiscall leveldb::DBImpl::GetSnapshot(DBImpl *this)

{
  int iVar1;
  SnapshotImpl *pSVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    pSVar2 = SnapshotList::New(&this->snapshots_,this->versions_->last_sequence_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return &pSVar2->super_Snapshot;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

const Snapshot* DBImpl::GetSnapshot() {
  MutexLock l(&mutex_);
  return snapshots_.New(versions_->LastSequence());
}